

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<anurbs::Line<2L>,_std::shared_ptr<anurbs::Line<2L>_>_> * __thiscall
pybind11::class_<anurbs::Line<2l>,std::shared_ptr<anurbs::Line<2l>>>::
def_static<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>(*)(Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,bool),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
          (class_<anurbs::Line<2l>,std::shared_ptr<anurbs::Line<2l>>> *this,char *name_,
          _func_pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_bool
          **f,arg *extra,arg *extra_1,arg *extra_2,arg_v *extra_3)

{
  _func_pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_bool
  *f_00;
  object local_70;
  handle local_68;
  cpp_function cf;
  handle local_58;
  object local_50;
  char *local_48 [4];
  
  f_00 = *f;
  local_70.super_handle.m_ptr = *(handle *)this;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_48[0] = name_;
  getattr((pybind11 *)&local_58,local_70.super_handle,name_,(PyObject *)&_Py_NoneStruct);
  local_68.m_ptr = local_58.m_ptr;
  cpp_function::
  cpp_function<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,bool,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
            (&cf,f_00,(name *)local_48,(scope *)&local_70,(sibling *)&local_68,extra,extra_1,extra_2
             ,extra_3);
  pybind11::object::~object((object *)&local_58);
  pybind11::object::~object(&local_50);
  staticmethod::staticmethod((staticmethod *)&local_70,(object *)&cf);
  cpp_function::name((cpp_function *)&local_68);
  detail::object_api<pybind11::handle>::attr
            ((obj_attr_accessor *)local_48,(object_api<pybind11::handle> *)this,local_68);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_48,
             (staticmethod *)&local_70);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_48);
  pybind11::object::~object((object *)&local_68);
  pybind11::object::~object(&local_70);
  pybind11::object::~object((object *)&cf);
  return (class_<anurbs::Line<2L>,_std::shared_ptr<anurbs::Line<2L>_>_> *)this;
}

Assistant:

class_ &
    def_static(const char *name_, Func &&f, const Extra&... extra) {
        static_assert(!std::is_member_function_pointer<Func>::value,
                "def_static(...) called with a non-static member function pointer");
        cpp_function cf(std::forward<Func>(f), name(name_), scope(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = staticmethod(cf);
        return *this;
    }